

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.h
# Opt level: O3

void __thiscall
SchemePrimitiveProcedure::SchemePrimitiveProcedure
          (SchemePrimitiveProcedure *this,string *name_,longlong minargs,longlong maxargs)

{
  (this->super_SchemeProcedure).name._M_dataplus._M_p =
       (pointer)&(this->super_SchemeProcedure).name.field_2;
  (this->super_SchemeProcedure).name._M_string_length = 0;
  (this->super_SchemeProcedure).name.field_2._M_local_buf[0] = '\0';
  (this->super_SchemeProcedure).arity.first = 0;
  (this->super_SchemeProcedure).arity.second = 0;
  (this->super_SchemeProcedure).super_SchemeObject._vptr_SchemeObject =
       (_func_int **)&PTR__SchemeProcedure_0017a7c0;
  std::__cxx11::string::_M_assign((string *)&(this->super_SchemeProcedure).name);
  (this->super_SchemeProcedure).arity.first = minargs;
  (this->super_SchemeProcedure).arity.second = maxargs;
  return;
}

Assistant:

SchemePrimitiveProcedure(const std::string &name_, long long minargs, long long maxargs)
    {
        name = name_;
        arity.first = minargs;
        arity.second = maxargs;
    }